

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

unique_ptr<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>_>
pbrt::LightPathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  int iVar1;
  allocator<char> *in_RSI;
  __uniq_ptr_data<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>,_true,_true>
  in_RDI;
  ParameterDictionary *in_R9;
  int maxDepth;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_59;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffffa8;
  PrimitiveHandle *in_stack_ffffffffffffffb0;
  SamplerHandle *in_stack_ffffffffffffffb8;
  CameraHandle *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  __s = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff90,(char *)__s,in_RSI);
  iVar1 = ParameterDictionary::GetOneInt
                    (in_R9,(string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0
                    );
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator(&local_59);
  std::
  make_unique<pbrt::LightPathIntegrator,int&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&>
            ((int *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return (__uniq_ptr_data<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>,_true,_true>
          )(tuple<pbrt::LightPathIntegrator_*,_std::default_delete<pbrt::LightPathIntegrator>_>)
           in_RDI.
           super___uniq_ptr_impl<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>_>
           ._M_t.
           super__Tuple_impl<0UL,_pbrt::LightPathIntegrator_*,_std::default_delete<pbrt::LightPathIntegrator>_>
           .super__Head_base<0UL,_pbrt::LightPathIntegrator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<LightPathIntegrator> LightPathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    return std::make_unique<LightPathIntegrator>(maxDepth, camera, sampler, aggregate,
                                                 lights);
}